

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

void __thiscall ON_NurbsCurve::SetUnclampedTagForExperts(ON_NurbsCurve *this,bool bUnclampedTag)

{
  bool bVar1;
  uint uVar2;
  bool bUnclampedTag_local;
  ON_NurbsCurve *this_local;
  
  if (((bUnclampedTag) &&
      (bVar1 = Internal_UnclampedKnots(this->m_order,this->m_cv_count,this->m_cv,this->m_knot),
      bVar1)) &&
     (uVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])(),
     (uVar2 & 1) == 0)) {
    this->m_knot_capacity_and_tags = this->m_knot_capacity_and_tags | 0x40000000;
  }
  else {
    this->m_knot_capacity_and_tags = this->m_knot_capacity_and_tags & 0xbfffffff;
  }
  return;
}

Assistant:

void ON_NurbsCurve::SetUnclampedTagForExperts(
  bool bUnclampedTag
)
{
  if (
    bUnclampedTag
    && Internal_UnclampedKnots(m_order, m_cv_count, m_cv, m_knot)
    && false == this->IsPeriodic()
    )
    m_knot_capacity_and_tags |= ON_NurbsCurve::masks::unclamped_knots_tag;
  else
    m_knot_capacity_and_tags &= ~ON_NurbsCurve::masks::unclamped_knots_tag;
}